

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O0

void __thiscall Imf_3_3::FrameBuffer::insert(FrameBuffer *this,char *name,Slice *slice)

{
  ArgExc *this_00;
  mapped_type *__dest;
  char *in_RDX;
  char *in_RSI;
  stringstream _iex_throw_s;
  stringstream *in_stack_fffffffffffffd38;
  Name *in_stack_fffffffffffffd40;
  key_type *in_stack_fffffffffffffd78;
  map<Imf_3_3::Name,_Imf_3_3::Slice,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Slice>_>_>
  *in_stack_fffffffffffffd80;
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  if (*in_RSI == '\0') {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"Frame buffer slice name cannot be an empty string.");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(this_00,in_stack_fffffffffffffd38);
    __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  Name::Name(in_stack_fffffffffffffd40,in_RDX);
  __dest = std::
           map<Imf_3_3::Name,_Imf_3_3::Slice,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Slice>_>_>
           ::operator[](in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  memcpy(__dest,in_RDX,0x32);
  return;
}

Assistant:

void
FrameBuffer::insert (const char name[], const Slice& slice)
{
    if (name[0] == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Frame buffer slice name cannot be an empty string.");
    }

    _map[name] = slice;
}